

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockActualCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCheckedActualCall_remainderOfMockActualCallTraceWorksAsItShould_Test::testBody
          (TEST_MockCheckedActualCall_remainderOfMockActualCallTraceWorksAsItShould_Test *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  UtestShell *pUVar4;
  char *pcVar5;
  char *pcVar6;
  TestTerminator *pTVar7;
  long lVar8;
  unsigned_long uVar9;
  cpputest_longlong cVar10;
  cpputest_ulonglong cVar11;
  void *pvVar12;
  _func_void *p_Var13;
  double dVar14;
  SimpleString local_230;
  MockNamedValue local_220;
  MockNamedValue local_1d0;
  SimpleString local_180;
  SimpleString local_170;
  SimpleString local_160;
  SimpleString local_150;
  SimpleString local_140;
  undefined1 local_130 [8];
  SimpleString expectedString;
  SimpleString local_110;
  SimpleString local_100;
  SimpleString local_f0;
  SimpleString local_e0;
  SimpleString local_d0;
  SimpleString local_c0;
  SimpleString local_b0;
  SimpleString local_a0;
  SimpleString local_90;
  SimpleString local_80;
  SimpleString local_70 [2];
  SimpleString local_50;
  undefined1 local_40 [8];
  MockActualCallTrace actual;
  _func_void *function_value;
  undefined4 local_18;
  undefined1 local_14 [2];
  uchar mem_buffer [2];
  int const_value;
  int value;
  TEST_MockCheckedActualCall_remainderOfMockActualCallTraceWorksAsItShould_Test *this_local;
  
  local_18 = 1;
  function_value._6_2_ = 0x15fe;
  actual.traceBuffer_.bufferSize_ = 0xdead;
  MockActualCallTrace::MockActualCallTrace((MockActualCallTrace *)local_40);
  SimpleString::SimpleString(&local_50,"func");
  MockActualCallTrace::withName((MockActualCallTrace *)local_40,&local_50);
  SimpleString::~SimpleString(&local_50);
  MockActualCallTrace::withCallOrder((MockActualCallTrace *)local_40,1);
  MockActualCallTrace::onObject((MockActualCallTrace *)local_40,local_14);
  SimpleString::SimpleString(local_70,"bool");
  MockActualCallTrace::withBoolParameter((MockActualCallTrace *)local_40,local_70,true);
  SimpleString::~SimpleString(local_70);
  SimpleString::SimpleString(&local_80,"unsigned_int");
  MockActualCallTrace::withUnsignedIntParameter((MockActualCallTrace *)local_40,&local_80,1);
  SimpleString::~SimpleString(&local_80);
  SimpleString::SimpleString(&local_90,"unsigned_long");
  MockActualCallTrace::withUnsignedLongIntParameter((MockActualCallTrace *)local_40,&local_90,1);
  SimpleString::~SimpleString(&local_90);
  SimpleString::SimpleString(&local_a0,"long_int");
  MockActualCallTrace::withLongIntParameter((MockActualCallTrace *)local_40,&local_a0,1);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::SimpleString(&local_b0,"long_long_int");
  MockActualCallTrace::withLongLongIntParameter((MockActualCallTrace *)local_40,&local_b0,1);
  SimpleString::~SimpleString(&local_b0);
  SimpleString::SimpleString(&local_c0,"unsigned_long_long_int");
  MockActualCallTrace::withUnsignedLongLongIntParameter((MockActualCallTrace *)local_40,&local_c0,1)
  ;
  SimpleString::~SimpleString(&local_c0);
  SimpleString::SimpleString(&local_d0,"pointer");
  MockActualCallTrace::withPointerParameter((MockActualCallTrace *)local_40,&local_d0,local_14);
  SimpleString::~SimpleString(&local_d0);
  SimpleString::SimpleString(&local_e0,"const_pointer");
  MockActualCallTrace::withConstPointerParameter
            ((MockActualCallTrace *)local_40,&local_e0,&local_18);
  SimpleString::~SimpleString(&local_e0);
  SimpleString::SimpleString(&local_f0,"function_pointer");
  MockActualCallTrace::withFunctionPointerParameter
            ((MockActualCallTrace *)local_40,&local_f0,(_func_void *)actual.traceBuffer_.bufferSize_
            );
  SimpleString::~SimpleString(&local_f0);
  SimpleString::SimpleString(&local_100,"mem_buffer");
  MockActualCallTrace::withMemoryBufferParameter
            ((MockActualCallTrace *)local_40,&local_100,(uchar *)((long)&function_value + 6),2);
  SimpleString::~SimpleString(&local_100);
  SimpleString::SimpleString(&local_110,"int");
  SimpleString::SimpleString((SimpleString *)&expectedString.bufferSize_,"named_type");
  MockActualCallTrace::withParameterOfType
            ((MockActualCallTrace *)local_40,&local_110,(SimpleString *)&expectedString.bufferSize_,
             &local_18);
  SimpleString::~SimpleString((SimpleString *)&expectedString.bufferSize_);
  SimpleString::~SimpleString(&local_110);
  SimpleString::SimpleString((SimpleString *)local_130,"\nFunction name:func");
  SimpleString::operator+=((SimpleString *)local_130," withCallOrder:1");
  SimpleString::operator+=((SimpleString *)local_130," onObject:0x");
  HexStringFrom(&local_140);
  SimpleString::operator+=((SimpleString *)local_130,&local_140);
  SimpleString::~SimpleString(&local_140);
  SimpleString::operator+=((SimpleString *)local_130," bool:true");
  SimpleString::operator+=((SimpleString *)local_130," unsigned_int:1 (0x1)");
  SimpleString::operator+=((SimpleString *)local_130," unsigned_long:1 (0x1)");
  SimpleString::operator+=((SimpleString *)local_130," long_int:1 (0x1)");
  SimpleString::operator+=((SimpleString *)local_130," long_long_int:1 (0x1)");
  SimpleString::operator+=((SimpleString *)local_130," unsigned_long_long_int:1 (0x1)");
  SimpleString::operator+=((SimpleString *)local_130," pointer:0x");
  HexStringFrom(&local_150);
  SimpleString::operator+=((SimpleString *)local_130,&local_150);
  SimpleString::~SimpleString(&local_150);
  SimpleString::operator+=((SimpleString *)local_130," const_pointer:0x");
  HexStringFrom(&local_160);
  SimpleString::operator+=((SimpleString *)local_130,&local_160);
  SimpleString::~SimpleString(&local_160);
  SimpleString::operator+=((SimpleString *)local_130," function_pointer:0x");
  HexStringFrom((_func_void *)&local_170);
  SimpleString::operator+=((SimpleString *)local_130,&local_170);
  SimpleString::~SimpleString(&local_170);
  SimpleString::operator+=((SimpleString *)local_130," mem_buffer:Size = 2 | HexContents = FE 15");
  SimpleString::operator+=((SimpleString *)local_130," int named_type:0x");
  HexStringFrom(&local_180);
  SimpleString::operator+=((SimpleString *)local_130,&local_180);
  SimpleString::~SimpleString(&local_180);
  pUVar4 = UtestShell::getCurrent();
  pcVar5 = SimpleString::asCharString((SimpleString *)local_130);
  pcVar6 = MockActualCallTrace::getTraceOutput((MockActualCallTrace *)local_40);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[9])
            (pUVar4,pcVar5,pcVar6,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0xe9,pTVar7);
  pUVar4 = UtestShell::getCurrent();
  bVar1 = MockActualCallTrace::hasReturnValue((MockActualCallTrace *)local_40);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)!bVar1,"CHECK_FALSE","actual.hasReturnValue()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0xeb,pTVar7);
  pUVar4 = UtestShell::getCurrent();
  MockActualCallTrace::returnValue(&local_1d0,(MockActualCallTrace *)local_40);
  SimpleString::SimpleString(&local_230,"");
  MockNamedValue::MockNamedValue(&local_220,&local_230);
  bVar1 = MockNamedValue::equals(&local_1d0,&local_220);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)bVar1,"CHECK","actual.returnValue().equals(MockNamedValue(\"\"))",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0xec,pTVar7);
  MockNamedValue::~MockNamedValue(&local_220);
  SimpleString::~SimpleString(&local_230);
  MockNamedValue::~MockNamedValue(&local_1d0);
  pUVar4 = UtestShell::getCurrent();
  bVar1 = MockActualCallTrace::returnBoolValue((MockActualCallTrace *)local_40);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)!bVar1,"CHECK","false == actual.returnBoolValue()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0xed,pTVar7);
  pUVar4 = UtestShell::getCurrent();
  bVar1 = MockActualCallTrace::returnBoolValueOrDefault((MockActualCallTrace *)local_40,true);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)!bVar1,"CHECK","false == actual.returnBoolValueOrDefault(true)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0xee,pTVar7);
  pUVar4 = UtestShell::getCurrent();
  lVar8 = MockActualCallTrace::returnLongIntValue((MockActualCallTrace *)local_40);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(lVar8 == 0),"CHECK","0 == actual.returnLongIntValue()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0xef,pTVar7);
  pUVar4 = UtestShell::getCurrent();
  uVar9 = MockActualCallTrace::returnUnsignedLongIntValue((MockActualCallTrace *)local_40);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(uVar9 == 0),"CHECK","0 == actual.returnUnsignedLongIntValue()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0xf0,pTVar7);
  pUVar4 = UtestShell::getCurrent();
  iVar2 = MockActualCallTrace::returnIntValue((MockActualCallTrace *)local_40);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(iVar2 == 0),"CHECK","0 == actual.returnIntValue()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0xf1,pTVar7);
  pUVar4 = UtestShell::getCurrent();
  uVar9 = MockActualCallTrace::returnUnsignedLongIntValueOrDefault
                    ((MockActualCallTrace *)local_40,1);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(uVar9 == 0),"CHECK",
             "0 == actual.returnUnsignedLongIntValueOrDefault(1ul)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0xf2,pTVar7);
  pUVar4 = UtestShell::getCurrent();
  iVar2 = MockActualCallTrace::returnIntValueOrDefault((MockActualCallTrace *)local_40,1);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(iVar2 == 0),"CHECK","0 == actual.returnIntValueOrDefault(1)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0xf3,pTVar7);
  pUVar4 = UtestShell::getCurrent();
  lVar8 = MockActualCallTrace::returnLongIntValue((MockActualCallTrace *)local_40);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(lVar8 == 0),"CHECK","0 == actual.returnLongIntValue()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0xf4,pTVar7);
  pUVar4 = UtestShell::getCurrent();
  lVar8 = MockActualCallTrace::returnLongIntValueOrDefault((MockActualCallTrace *)local_40,1);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(lVar8 == 0),"CHECK","0 == actual.returnLongIntValueOrDefault(1l)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0xf5,pTVar7);
  pUVar4 = UtestShell::getCurrent();
  cVar10 = MockActualCallTrace::returnLongLongIntValue((MockActualCallTrace *)local_40);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(cVar10 == 0),"CHECK","0 == actual.returnLongLongIntValue()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0xf7,pTVar7);
  pUVar4 = UtestShell::getCurrent();
  cVar10 = MockActualCallTrace::returnLongLongIntValueOrDefault((MockActualCallTrace *)local_40,1);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(cVar10 == 0),"CHECK","0 == actual.returnLongLongIntValueOrDefault(1ll)",
             0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0xf8,pTVar7);
  pUVar4 = UtestShell::getCurrent();
  cVar11 = MockActualCallTrace::returnUnsignedLongLongIntValue((MockActualCallTrace *)local_40);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(cVar11 == 0),"CHECK","0 == actual.returnUnsignedLongLongIntValue()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0xf9,pTVar7);
  pUVar4 = UtestShell::getCurrent();
  cVar11 = MockActualCallTrace::returnUnsignedLongLongIntValueOrDefault
                     ((MockActualCallTrace *)local_40,1);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(cVar11 == 0),"CHECK",
             "0 == actual.returnUnsignedLongLongIntValueOrDefault(1ull)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0xfa,pTVar7);
  pUVar4 = UtestShell::getCurrent();
  uVar3 = MockActualCallTrace::returnUnsignedIntValue((MockActualCallTrace *)local_40);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(uVar3 == 0),"CHECK","0 == actual.returnUnsignedIntValue()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0xfc,pTVar7);
  pUVar4 = UtestShell::getCurrent();
  uVar3 = MockActualCallTrace::returnUnsignedIntValueOrDefault((MockActualCallTrace *)local_40,1);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(uVar3 == 0),"CHECK","0 == actual.returnUnsignedIntValueOrDefault(1u)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0xfd,pTVar7);
  pUVar4 = UtestShell::getCurrent();
  dVar14 = MockActualCallTrace::returnDoubleValue((MockActualCallTrace *)local_40);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0x15])
            (0,dVar14,pUVar4,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0xfe,pTVar7);
  pUVar4 = UtestShell::getCurrent();
  dVar14 = MockActualCallTrace::returnDoubleValueOrDefault((MockActualCallTrace *)local_40,1.0);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0x15])
            (0,dVar14,pUVar4,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0xff,pTVar7);
  pUVar4 = UtestShell::getCurrent();
  pcVar5 = MockActualCallTrace::returnStringValueOrDefault((MockActualCallTrace *)local_40,"bla");
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[9])
            (pUVar4,"",pcVar5,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0x100,pTVar7);
  pUVar4 = UtestShell::getCurrent();
  pcVar5 = MockActualCallTrace::returnStringValue((MockActualCallTrace *)local_40);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[9])
            (pUVar4,"",pcVar5,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0x101,pTVar7);
  pUVar4 = UtestShell::getCurrent();
  pvVar12 = MockActualCallTrace::returnPointerValue((MockActualCallTrace *)local_40);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(pvVar12 == (void *)0x0),"CHECK","NULLPTR == actual.returnPointerValue()"
             ,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0x102,pTVar7);
  pUVar4 = UtestShell::getCurrent();
  pvVar12 = MockActualCallTrace::returnPointerValueOrDefault
                      ((MockActualCallTrace *)local_40,(void *)0x0);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(pvVar12 == (void *)0x0),"CHECK",
             "NULLPTR == actual.returnPointerValueOrDefault((void*) NULLPTR)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0x103,pTVar7);
  pUVar4 = UtestShell::getCurrent();
  pvVar12 = MockActualCallTrace::returnConstPointerValue((MockActualCallTrace *)local_40);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(pvVar12 == (void *)0x0),"CHECK",
             "NULLPTR == actual.returnConstPointerValue()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0x104,pTVar7);
  pUVar4 = UtestShell::getCurrent();
  pvVar12 = MockActualCallTrace::returnConstPointerValueOrDefault
                      ((MockActualCallTrace *)local_40,(void *)0x0);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(pvVar12 == (void *)0x0),"CHECK",
             "NULLPTR == actual.returnConstPointerValueOrDefault((const void*) NULLPTR)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0x105,pTVar7);
  pUVar4 = UtestShell::getCurrent();
  p_Var13 = MockActualCallTrace::returnFunctionPointerValue((MockActualCallTrace *)local_40);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(p_Var13 == (_func_void *)0x0),"CHECK",
             "NULLPTR == actual.returnFunctionPointerValue()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0x106,pTVar7);
  pUVar4 = UtestShell::getCurrent();
  p_Var13 = MockActualCallTrace::returnFunctionPointerValueOrDefault
                      ((MockActualCallTrace *)local_40,(_func_void *)0x0);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(p_Var13 == (_func_void *)0x0),"CHECK",
             "NULLPTR == actual.returnFunctionPointerValueOrDefault((void (*)()) NULLPTR)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0x107,pTVar7);
  SimpleString::~SimpleString((SimpleString *)local_130);
  MockActualCallTrace::~MockActualCallTrace((MockActualCallTrace *)local_40);
  return;
}

Assistant:

TEST(MockCheckedActualCall, remainderOfMockActualCallTraceWorksAsItShould)
{
    int value;
    const int const_value = 1;
    const unsigned char mem_buffer[] = { 0xFE, 0x15 };
    void (*function_value)() = (void (*)())0xDEAD;
    MockActualCallTrace actual;
    actual.withName("func");
    actual.withCallOrder(1);
    actual.onObject(&value);

    actual.withBoolParameter("bool", true);
    actual.withUnsignedIntParameter("unsigned_int", (unsigned int) 1);
    actual.withUnsignedLongIntParameter("unsigned_long", (unsigned long)1);
    actual.withLongIntParameter("long_int", (long int) 1);
#if CPPUTEST_USE_LONG_LONG
    actual.withLongLongIntParameter("long_long_int", (long long int) 1);
    actual.withUnsignedLongLongIntParameter("unsigned_long_long_int", (unsigned long long int) 1);
#endif
    actual.withPointerParameter("pointer", &value);
    actual.withConstPointerParameter("const_pointer", &const_value);
    actual.withFunctionPointerParameter("function_pointer", function_value);
    actual.withMemoryBufferParameter("mem_buffer", mem_buffer, sizeof(mem_buffer));
    actual.withParameterOfType("int", "named_type", &const_value);

    SimpleString expectedString("\nFunction name:func");
    expectedString += " withCallOrder:1";
    expectedString += " onObject:0x";
    expectedString += HexStringFrom(&value);
    expectedString += " bool:true";
    expectedString += " unsigned_int:1 (0x1)";
    expectedString += " unsigned_long:1 (0x1)";
    expectedString += " long_int:1 (0x1)";
#if CPPUTEST_USE_LONG_LONG
    expectedString += " long_long_int:1 (0x1)";
    expectedString += " unsigned_long_long_int:1 (0x1)";
#endif
    expectedString += " pointer:0x";
    expectedString += HexStringFrom(&value);
    expectedString += " const_pointer:0x";
    expectedString += HexStringFrom(&const_value);
    expectedString += " function_pointer:0x";
    expectedString += HexStringFrom(function_value);
    expectedString += " mem_buffer:Size = 2 | HexContents = FE 15";
    expectedString += " int named_type:0x";
    expectedString += HexStringFrom(&const_value);
    STRCMP_EQUAL(expectedString.asCharString(), actual.getTraceOutput());

    CHECK_FALSE(actual.hasReturnValue());
    CHECK(actual.returnValue().equals(MockNamedValue("")));
    CHECK(false == actual.returnBoolValue());
    CHECK(false == actual.returnBoolValueOrDefault(true));
    CHECK(0 == actual.returnLongIntValue());
    CHECK(0 == actual.returnUnsignedLongIntValue());
    CHECK(0 == actual.returnIntValue());
    CHECK(0 == actual.returnUnsignedLongIntValueOrDefault(1ul));
    CHECK(0 == actual.returnIntValueOrDefault(1));
    CHECK(0 == actual.returnLongIntValue());
    CHECK(0 == actual.returnLongIntValueOrDefault(1l));
#if CPPUTEST_USE_LONG_LONG
    CHECK(0 == actual.returnLongLongIntValue());
    CHECK(0 == actual.returnLongLongIntValueOrDefault(1ll));
    CHECK(0 == actual.returnUnsignedLongLongIntValue());
    CHECK(0 == actual.returnUnsignedLongLongIntValueOrDefault(1ull));
#endif
    CHECK(0 == actual.returnUnsignedIntValue());
    CHECK(0 == actual.returnUnsignedIntValueOrDefault(1u));
    DOUBLES_EQUAL(0.0, actual.returnDoubleValue(), 0.0);
    DOUBLES_EQUAL(0.0, actual.returnDoubleValueOrDefault(1.0), 0.0);
    STRCMP_EQUAL("", actual.returnStringValueOrDefault("bla"));
    STRCMP_EQUAL("", actual.returnStringValue());
    CHECK(NULLPTR == actual.returnPointerValue());
    CHECK(NULLPTR == actual.returnPointerValueOrDefault((void*) NULLPTR));
    CHECK(NULLPTR == actual.returnConstPointerValue());
    CHECK(NULLPTR == actual.returnConstPointerValueOrDefault((const void*) NULLPTR));
    CHECK(NULLPTR == actual.returnFunctionPointerValue());
    CHECK(NULLPTR == actual.returnFunctionPointerValueOrDefault((void (*)()) NULLPTR));
}